

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O0

uint32 __thiscall Js::JavascriptStackWalker::GetByteCodeOffset(JavascriptStackWalker *this)

{
  bool bVar1;
  uint32 local_1c;
  JavascriptStackWalker *pJStack_18;
  uint32 offset;
  JavascriptStackWalker *this_local;
  
  local_1c = 0;
  pJStack_18 = this;
  bVar1 = IsJavascriptFrame(this);
  if (bVar1) {
    if ((this->interpreterFrame != (InterpreterStackFrame *)0x0) &&
       (bVar1 = TryGetByteCodeOffsetFromInterpreterFrame(this,&local_1c), bVar1)) {
      return local_1c;
    }
    bVar1 = TryGetByteCodeOffsetFromNativeFrame(this,&local_1c);
    if (bVar1) {
      return local_1c;
    }
  }
  return local_1c;
}

Assistant:

uint32 JavascriptStackWalker::GetByteCodeOffset() const
    {
        uint32 offset = 0;
        if (this->IsJavascriptFrame())
        {
            if (this->interpreterFrame)
            {
                if (this->TryGetByteCodeOffsetFromInterpreterFrame(offset))
                {
                    return offset;
                }
            }

#if ENABLE_NATIVE_CODEGEN
            if (TryGetByteCodeOffsetFromNativeFrame(offset))
            {
                return offset;
            }
#endif
        }
        return offset;
    }